

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3fa.h
# Opt level: O3

void DirectionalLight_set(void *super,Vec3fa *direction,Vec3fa *radiance,float cosAngle)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [12];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar10 [16];
  float fVar14;
  float fVar15;
  vfloat4 a;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  
  fVar3 = (direction->field_0).m128[0];
  fVar5 = (direction->field_0).m128[2];
  fVar4 = -(direction->field_0).m128[1];
  fVar7 = -fVar5;
  auVar6._8_4_ = 0xffffffff;
  auVar6._0_8_ = 0xffffffffffffffff;
  if (fVar4 * fVar4 + fVar5 * fVar5 + 0.0 <= fVar3 * fVar3 + fVar7 * fVar7 + 0.0) {
    auVar6 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar5 = (float)((uint)fVar5 & auVar6._4_4_);
  fVar7 = (float)(~auVar6._0_4_ & (uint)fVar7);
  fVar12 = (float)(~auVar6._8_4_ & (uint)fVar3 | (uint)fVar4 & auVar6._8_4_);
  fVar3 = fVar5 * fVar5;
  fVar4 = fVar12 * fVar12;
  fVar14 = fVar3 + fVar7 * fVar7 + fVar4;
  fVar15 = fVar3 + fVar3 + 0.0;
  fVar4 = fVar3 + fVar4 + fVar4;
  fVar3 = fVar3 + 0.0 + 0.0;
  auVar16._4_4_ = fVar15;
  auVar16._0_4_ = fVar14;
  auVar16._8_4_ = fVar4;
  auVar16._12_4_ = fVar3;
  auVar17._4_4_ = fVar15;
  auVar17._0_4_ = fVar14;
  auVar17._8_4_ = fVar4;
  auVar17._12_4_ = fVar3;
  auVar17 = rsqrtss(auVar16,auVar17);
  fVar3 = auVar17._0_4_;
  fVar8 = fVar3 * 1.5 - fVar3 * fVar3 * fVar14 * 0.5 * fVar3;
  fVar7 = fVar8 * fVar7;
  fVar5 = fVar8 * fVar5;
  fVar12 = fVar8 * fVar12;
  fVar8 = fVar8 * 0.0;
  fVar3 = (direction->field_0).m128[0];
  fVar4 = (direction->field_0).m128[1];
  fVar14 = (direction->field_0).m128[2];
  fVar15 = (direction->field_0).m128[3];
  *(float *)((long)super + 0x10) = fVar7;
  *(float *)((long)super + 0x14) = fVar5;
  *(float *)((long)super + 0x18) = fVar12;
  *(float *)((long)super + 0x1c) = fVar8;
  fVar9 = fVar5 * fVar3 - fVar4 * fVar7;
  fVar11 = fVar12 * fVar4 - fVar14 * fVar5;
  fVar7 = fVar7 * fVar14 - fVar3 * fVar12;
  fVar8 = fVar8 * fVar15 - fVar15 * fVar8;
  fVar5 = fVar11 * fVar11;
  fVar12 = fVar7 * fVar7;
  fVar13 = fVar8 * fVar8;
  fVar18 = fVar12 + fVar5 + fVar9 * fVar9;
  fVar19 = fVar13 + fVar5 + fVar5;
  fVar12 = fVar12 + fVar5 + fVar12;
  fVar13 = fVar13 + fVar5 + fVar13;
  auVar10._4_4_ = fVar19;
  auVar10._0_4_ = fVar18;
  auVar10._8_4_ = fVar12;
  auVar10._12_4_ = fVar13;
  auVar1._4_4_ = fVar19;
  auVar1._0_4_ = fVar18;
  auVar1._8_4_ = fVar12;
  auVar1._12_4_ = fVar13;
  auVar17 = rsqrtss(auVar10,auVar1);
  fVar5 = auVar17._0_4_;
  fVar5 = fVar5 * 1.5 - fVar5 * fVar5 * fVar18 * 0.5 * fVar5;
  *(float *)((long)super + 0x20) = fVar5 * fVar11;
  *(float *)((long)super + 0x24) = fVar5 * fVar7;
  *(float *)((long)super + 0x28) = fVar5 * fVar9;
  *(float *)((long)super + 0x2c) = fVar5 * fVar8;
  *(float *)((long)super + 0x30) = fVar3;
  *(float *)((long)super + 0x34) = fVar4;
  *(float *)((long)super + 0x38) = fVar14;
  *(float *)((long)super + 0x3c) = fVar15;
  uVar2 = *(undefined8 *)((long)&radiance->field_0 + 8);
  *(undefined8 *)((long)super + 0x40) = *(undefined8 *)&radiance->field_0;
  *(undefined8 *)((long)super + 0x48) = uVar2;
  *(float *)((long)super + 0x50) = cosAngle;
  if (0.9999999 <= cosAngle) {
    fVar3 = INFINITY;
  }
  else {
    fVar3 = (1.0 - cosAngle) * 6.2831855;
    auVar17 = rcpss(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
    fVar3 = (2.0 - fVar3 * auVar17._0_4_) * auVar17._0_4_;
  }
  *(float *)((long)super + 0x54) = fVar3;
  return;
}

Assistant:

__forceinline          Vec3fa( const float x, const float y, const float z) : m128(_mm_set_ps(0, z, y, x)) {}